

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display_settings.c
# Opt level: O0

int al_get_new_display_option(int option,int *importance)

{
  ALLEGRO_EXTRA_DISPLAY_SETTINGS *pAVar1;
  undefined4 *in_RSI;
  int in_EDI;
  ALLEGRO_EXTRA_DISPLAY_SETTINGS *extras;
  int local_4;
  
  pAVar1 = _al_get_new_display_settings();
  if ((pAVar1->required & 1L << ((byte)in_EDI & 0x3f)) == 0) {
    if ((pAVar1->suggested & 1L << ((byte)in_EDI & 0x3f)) == 0) {
      if (in_RSI != (undefined4 *)0x0) {
        *in_RSI = 0;
      }
      local_4 = 0;
    }
    else {
      if (in_RSI != (undefined4 *)0x0) {
        *in_RSI = 2;
      }
      local_4 = pAVar1->settings[in_EDI];
    }
  }
  else {
    if (in_RSI != (undefined4 *)0x0) {
      *in_RSI = 1;
    }
    local_4 = pAVar1->settings[in_EDI];
  }
  return local_4;
}

Assistant:

int al_get_new_display_option(int option, int *importance)
{
   ALLEGRO_EXTRA_DISPLAY_SETTINGS *extras;
   extras = _al_get_new_display_settings();
   if (extras->required & ((int64_t)1 << option)) {
      if (importance) *importance = ALLEGRO_REQUIRE;
      return extras->settings[option];
   }
   if (extras->suggested & ((int64_t)1 << option)) {
      if (importance) *importance = ALLEGRO_SUGGEST;
      return extras->settings[option];
   }
   if (importance) *importance = ALLEGRO_DONTCARE;
   return 0;
}